

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_twist_accumulate(gc_twist *xd1,gc_twist *xd2,gc_twist *r)

{
  gc_twist *r_local;
  gc_twist *xd2_local;
  gc_twist *xd1_local;
  
  if (xd1 == (gc_twist *)0x0) {
    __assert_fail("xd1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x9b,
                  "void gc_twist_accumulate(const struct gc_twist *, const struct gc_twist *, struct gc_twist *)"
                 );
  }
  if (xd2 != (gc_twist *)0x0) {
    if (r != (gc_twist *)0x0) {
      la_daxpy_oe(3,1.0,(double *)xd1->angular_velocity,1,(double *)xd2->angular_velocity,1,
                  (double *)r->angular_velocity,1);
      la_daxpy_oe(3,1.0,(double *)xd1->linear_velocity,1,(double *)xd2->linear_velocity,1,
                  (double *)r->linear_velocity,1);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x9d,
                  "void gc_twist_accumulate(const struct gc_twist *, const struct gc_twist *, struct gc_twist *)"
                 );
  }
  __assert_fail("xd2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x9c,
                "void gc_twist_accumulate(const struct gc_twist *, const struct gc_twist *, struct gc_twist *)"
               );
}

Assistant:

void gc_twist_accumulate(
        const struct gc_twist *xd1,
        const struct gc_twist *xd2,
        struct gc_twist *r)
{
    assert(xd1);
    assert(xd2);
    assert(r);

    la_daxpy_oe(3,
            1.0, (double *)xd1->angular_velocity, 1,
            (double *)xd2->angular_velocity, 1,
            (double *)r->angular_velocity, 1);

    la_daxpy_oe(3,
            1.0, (double *)xd1->linear_velocity, 1,
            (double *)xd2->linear_velocity, 1,
            (double *)r->linear_velocity, 1);
}